

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall pbrt::ThreadPool::workerFunc(ThreadPool *this,int tIndex)

{
  long in_FS_OFFSET;
  unique_lock<std::mutex> lock;
  int local_2c;
  unique_lock<std::mutex> local_28;
  
  local_2c = tIndex;
  if (LOGGING_LogLevel < 1) {
    Log<int&>(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp"
              ,0x8a,"Started execution in worker thread %d",&local_2c);
  }
  *(int *)(in_FS_OFFSET + -0x488) = local_2c;
  std::unique_lock<std::mutex>::unique_lock(&local_28,&this->jobListMutex);
  while (this->shutdownThreads == false) {
    WorkOrWait(this,&local_28);
  }
  if (LOGGING_LogLevel < 1) {
    Log<int&>(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.cpp"
              ,0x91,"Exiting worker thread %d",&local_2c);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void ThreadPool::workerFunc(int tIndex) {
    LOG_VERBOSE("Started execution in worker thread %d", tIndex);
    ThreadIndex = tIndex;

    std::unique_lock<std::mutex> lock(jobListMutex);
    while (!shutdownThreads)
        WorkOrWait(&lock);

    LOG_VERBOSE("Exiting worker thread %d", tIndex);
}